

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionHelper.cpp
# Opt level: O0

string * __thiscall
EncryptionHelper::EncryptString
          (string *__return_storage_ptr__,EncryptionHelper *this,string *inStringToEncrypt)

{
  bool bVar1;
  ByteList *inEncryptionKey;
  IByteWriter *inOutputStream;
  OutputStreamTraits local_78;
  OutputStreamTraits traits;
  InputStringStream inputStream;
  IByteWriterWithPosition *encryptStream;
  OutputStringBufferStream buffer;
  string *inStringToEncrypt_local;
  EncryptionHelper *this_local;
  
  buffer._16_8_ = inStringToEncrypt;
  bVar1 = IsEncrypting(this);
  if ((bVar1) && (this->mXcryptStrings != (XCryptionCommon *)0x0)) {
    OutputStringBufferStream::OutputStringBufferStream((OutputStringBufferStream *)&encryptStream);
    inEncryptionKey = XCryptionCommon::GetCurrentObjectKey_abi_cxx11_(this->mXcryptStrings);
    bVar1 = XCryptionCommon::IsUsingAES(this->mXcryptStrings);
    inOutputStream =
         &CreateEncryptionWriter
                    (this,(IByteWriterWithPosition *)&encryptStream,inEncryptionKey,bVar1)->
          super_IByteWriter;
    if (inOutputStream == (IByteWriter *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)buffer._16_8_);
    }
    else {
      InputStringStream::InputStringStream((InputStringStream *)&traits,(string *)buffer._16_8_);
      OutputStreamTraits::OutputStreamTraits(&local_78,inOutputStream);
      OutputStreamTraits::CopyToOutputStream(&local_78,(IByteReader *)&traits);
      if (inOutputStream != (IByteWriter *)0x0) {
        (*inOutputStream->_vptr_IByteWriter[1])();
      }
      OutputStringBufferStream::ToString_abi_cxx11_
                (__return_storage_ptr__,(OutputStringBufferStream *)&encryptStream);
      OutputStreamTraits::~OutputStreamTraits(&local_78);
      InputStringStream::~InputStringStream((InputStringStream *)&traits);
    }
    OutputStringBufferStream::~OutputStringBufferStream((OutputStringBufferStream *)&encryptStream);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)buffer._16_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncryptionHelper::EncryptString(const std::string& inStringToEncrypt) {
	if (!IsEncrypting() || !mXcryptStrings)
		return inStringToEncrypt;

	OutputStringBufferStream buffer;

	IByteWriterWithPosition* encryptStream = CreateEncryptionWriter(&buffer, mXcryptStrings->GetCurrentObjectKey(), mXcryptStrings->IsUsingAES());
	if (encryptStream) {
		InputStringStream inputStream(inStringToEncrypt);
		OutputStreamTraits traits(encryptStream);
		traits.CopyToOutputStream(&inputStream);
		delete encryptStream; // free encryption stream (sometimes it will also mean flushing the output stream)

		return buffer.ToString();
	}
	else
		return inStringToEncrypt;
}